

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

int ftpfilemethod(OperationConfig *config,char *str)

{
  int iVar1;
  int iVar2;
  
  iVar1 = curl_strequal("singlecwd");
  if (iVar1 == 0) {
    iVar1 = curl_strequal("nocwd",str);
    if (iVar1 == 0) {
      iVar2 = curl_strequal("multicwd",str);
      iVar1 = 1;
      if (iVar2 == 0) {
        warnf(config->global,"unrecognized ftp file method \'%s\', using default\n",str);
      }
    }
    else {
      iVar1 = 2;
    }
  }
  else {
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

int ftpfilemethod(struct OperationConfig *config, const char *str)
{
  if(curl_strequal("singlecwd", str))
    return CURLFTPMETHOD_SINGLECWD;
  if(curl_strequal("nocwd", str))
    return CURLFTPMETHOD_NOCWD;
  if(curl_strequal("multicwd", str))
    return CURLFTPMETHOD_MULTICWD;

  warnf(config->global, "unrecognized ftp file method '%s', using default\n",
        str);

  return CURLFTPMETHOD_MULTICWD;
}